

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

bool selection_is_multiple_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *in_value;
  undefined1 local_58 [8];
  Am_Value_List obj_list;
  Am_Value object_modified_value;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object command;
  Am_Object *self_local;
  
  command.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_28,self);
  get_command_to_undo(&local_20);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)&obj_list.item);
    in_value = Am_Object::Peek(&local_20,0x16d,4);
    Am_Value::operator=((Am_Value *)&obj_list.item,in_value);
    bVar1 = Am_Value_List::Test((Am_Value *)&obj_list.item);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)local_58);
      Am_Value_List::operator=((Am_Value_List *)local_58,(Am_Value *)&obj_list.item);
      uVar2 = Am_Value_List::Length((Am_Value_List *)local_58);
      bVar1 = 1 < uVar2;
      if (bVar1) {
        self_local._7_1_ = 1;
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_58);
      if (!bVar1) goto LAB_002d54bc;
    }
    else {
LAB_002d54bc:
      bVar1 = false;
    }
    Am_Value::~Am_Value((Am_Value *)&obj_list.item);
    if (bVar1) goto LAB_002d54ed;
  }
  self_local._7_1_ = 0;
LAB_002d54ed:
  Am_Object::~Am_Object(&local_20);
  return (bool)(self_local._7_1_ & 1);
}

Assistant:

Am_Define_Formula(bool, selection_is_multiple)
{
  Am_Object command = get_command_to_undo(self);
  if (command.Valid()) {
    Am_Value object_modified_value;
    object_modified_value = command.Peek(Am_OBJECT_MODIFIED, Am_NO_DEPENDENCY);
    if (Am_Value_List::Test(object_modified_value)) {
      Am_Value_List obj_list;
      obj_list = object_modified_value;
      if (obj_list.Length() > 1)
        return true;
    }
  }
  return false;
}